

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

void bust_a_prompt(CHAR_DATA *ch)

{
  char cVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  undefined8 *puVar5;
  ROOM_INDEX_DATA *pRVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  char *pcVar16;
  DESCRIPTOR_DATA **ppDVar17;
  long lVar18;
  char *pcVar19;
  char buf2 [4608];
  char buf [4608];
  char doors [4608];
  char buf3 [4608];
  
  bVar7 = is_npc(ch);
  if ((((bVar7) || (bVar7 = str_cmp(ch->prompt,""), !bVar7)) ||
      (bVar7 = str_cmp(ch->prompt,"<%hhp %mm %vmv> "), !bVar7)) ||
     (bVar7 = str_cmp(ch->prompt,"<%hhp %mm %vmv>"), !bVar7)) {
    pcVar16 = get_char_color(ch,"prompt");
    uVar4 = ch->hit;
    sVar2 = ch->mana;
    sVar3 = ch->move;
    pcVar10 = END_COLOR(ch);
    sprintf(buf,"%s<%dhp %dm %dmv>%s ",pcVar16,(ulong)uVar4,(ulong)(uint)(int)sVar2,
            (ulong)(uint)(int)sVar3,pcVar10);
    send_to_char(buf,ch);
    return;
  }
  if ((ch->comm[0] & 0x2000000) != 0) {
    send_to_char("<AFK> ",ch);
  }
  pcVar10 = get_char_color(ch,"prompt");
  pcVar16 = ch->prompt;
  pcVar11 = END_COLOR(ch);
  sprintf(buf2,"%s%s%s",pcVar10,pcVar16,pcVar11);
  pcVar16 = buf3;
  strcpy(pcVar16,buf2);
  pcVar10 = buf;
  iVar13 = (int)pcVar10;
  pcVar11 = (char *)0x0;
  do {
    iVar14 = (int)pcVar10 - iVar13;
    pcVar16 = pcVar16 + 2;
    while( true ) {
      cVar1 = pcVar16[-2];
      if (cVar1 == '\0') {
        write_to_buffer(ch->desc,buf,iVar14);
        return;
      }
      if (cVar1 == '%') break;
      *pcVar10 = cVar1;
      pcVar10 = pcVar10 + 1;
      iVar14 = iVar14 + 1;
      pcVar16 = pcVar16 + 1;
    }
    cVar1 = pcVar16[-1];
    pcVar19 = " ";
    switch(cVar1) {
    case 'H':
      uVar15 = (ulong)(uint)(int)ch->max_hit;
      break;
    case 'I':
    case 'J':
    case 'K':
    case 'N':
    case 'O':
    case 'Q':
    case 'S':
    case 'T':
    case 'U':
    case 'W':
    case 'Y':
    case 'Z':
    case '[':
    case '\\':
    case ']':
    case '^':
    case '_':
    case '`':
    case 'b':
    case 'd':
    case 'f':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'n':
    case 's':
    case 'u':
    case 'w':
    case 'y':
      goto switchD_002d6daf_caseD_49;
    case 'L':
      buf2._0_2_ = (ushort)(ch->wait < 2) * 2 + 0x2b;
      goto LAB_002d7258;
    case 'M':
      uVar15 = (ulong)(uint)(int)ch->max_mana;
      break;
    case 'P':
      bVar7 = is_immortal(ch);
      if ((bVar7) && (ch->in_room != (ROOM_INDEX_DATA *)0x0)) {
        uVar15 = 0;
        ppDVar17 = &descriptor_list;
        while (ppDVar17 = &((DESCRIPTOR_DATA *)ppDVar17)->next->next,
              (DESCRIPTOR_DATA *)ppDVar17 != (DESCRIPTOR_DATA *)0x0) {
          if (((DESCRIPTOR_DATA *)ppDVar17)->connected == 0) {
            pRVar6 = ((DESCRIPTOR_DATA *)ppDVar17)->character->in_room;
            if ((pRVar6 != (ROOM_INDEX_DATA *)0x0) && (pRVar6->area == ch->in_room->area)) {
              bVar7 = can_see(ch,((DESCRIPTOR_DATA *)ppDVar17)->character);
              uVar15 = (ulong)((int)uVar15 + (uint)bVar7);
            }
          }
        }
        goto LAB_002d725f;
      }
LAB_002d7251:
      buf2[0] = ' ';
      buf2[1] = '\0';
      goto LAB_002d7258;
    case 'R':
      bVar7 = is_immortal(ch);
      if ((!bVar7) || (ch->in_room == (ROOM_INDEX_DATA *)0x0)) goto LAB_002d7251;
      uVar15 = (ulong)(uint)(int)ch->in_room->vnum;
      break;
    case 'V':
      uVar15 = (ulong)(uint)(int)ch->max_move;
      break;
    case 'X':
      bVar7 = is_npc(ch);
      uVar15 = 0;
      if (!bVar7) {
        sVar2 = ch->level;
        iVar14 = exp_per_level(ch);
        uVar15 = (ulong)(uint)(iVar14 * sVar2 - ch->exp);
      }
      break;
    case 'a':
      bVar7 = is_good(ch);
      pcVar11 = "good";
      if (!bVar7) {
        bVar7 = is_evil(ch);
        pcVar11 = "neutral";
        if (bVar7) {
          pcVar11 = "evil";
        }
      }
      goto LAB_002d71d0;
    case 'c':
      buf2[2] = '\0';
      buf2[0] = '\n';
      buf2[1] = '\r';
LAB_002d7258:
      pcVar19 = buf2;
      goto switchD_002d6daf_caseD_49;
    case 'e':
      doors[0] = '\0';
      bVar7 = false;
      for (lVar18 = 0; lVar18 != 0x18; lVar18 = lVar18 + 4) {
        puVar5 = *(undefined8 **)((long)ch->in_room->exit + lVar18 * 2);
        if ((((puVar5 != (undefined8 *)0x0) &&
             ((ROOM_INDEX_DATA *)*puVar5 != (ROOM_INDEX_DATA *)0x0)) &&
            (bVar8 = can_see_room(ch,(ROOM_INDEX_DATA *)*puVar5), bVar8)) &&
           ((((uint)puVar5[1] >> 8 & 1) == 0 &&
            (((puVar5[1] & 2) == 0 || (bVar8 = is_immortal(ch), bVar8)))))) {
          strcat(doors,(char *)((long)&DAT_003cf694 + (long)*(int *)((long)&DAT_003cf694 + lVar18)))
          ;
          bVar7 = true;
        }
      }
      if ((!bVar7) || ((bVar7 = is_affected_by(ch,0), bVar7 && (bVar7 = is_immortal(ch), !bVar7))))
      {
        sVar12 = strlen(buf);
        builtin_strncpy(buf + sVar12,"none",5);
      }
      pcVar11 = doors;
      goto LAB_002d71d0;
    case 'g':
      sprintf(buf2,"%ld",ch->gold);
      goto LAB_002d7290;
    case 'h':
      uVar15 = (ulong)(uint)ch->hit;
      break;
    case 'm':
      uVar15 = (ulong)(uint)(int)ch->mana;
      break;
    case 'o':
      bVar7 = is_editing(ch);
      pcVar19 = pcVar11;
      if (bVar7) {
        pcVar11 = olc_ed_name(ch);
        pcVar19 = olc_ed_vnum(ch);
        sprintf(buf2," (%s - %s)",pcVar11,pcVar19);
        goto LAB_002d7290;
      }
      goto switchD_002d6daf_caseD_49;
    case 'p':
      bVar7 = is_immortal(ch);
      if ((!bVar7) || (ch->in_room == (ROOM_INDEX_DATA *)0x0)) goto LAB_002d7251;
      uVar15 = 0;
      ppDVar17 = &descriptor_list;
      while (ppDVar17 = &((DESCRIPTOR_DATA *)ppDVar17)->next->next,
            (DESCRIPTOR_DATA *)ppDVar17 != (DESCRIPTOR_DATA *)0x0) {
        if (((DESCRIPTOR_DATA *)ppDVar17)->connected == 0) {
          pRVar6 = ((DESCRIPTOR_DATA *)ppDVar17)->character->in_room;
          if ((pRVar6 != (ROOM_INDEX_DATA *)0x0) && (pRVar6->area == ch->in_room->area)) {
            bVar7 = is_immortal(((DESCRIPTOR_DATA *)ppDVar17)->character);
            uVar15 = (ulong)((int)uVar15 + (uint)!bVar7);
          }
        }
      }
LAB_002d725f:
      pcVar11 = "%i";
      goto LAB_002d7289;
    case 'q':
      uVar15 = (ulong)(uint)(int)ch->pcdata->write_next;
      break;
    case 'r':
      if (ch->in_room == (ROOM_INDEX_DATA *)0x0) goto LAB_002d7251;
      bVar7 = is_npc(ch);
      if ((bVar7) || ((ch->act[0] & 0x2000) == 0)) {
        bVar7 = is_affected_by(ch,0);
        pcVar11 = "darkness";
        if (!bVar7) {
          bVar7 = room_is_dark(ch->in_room);
          pcVar11 = "darkness";
          if (!bVar7) goto LAB_002d6fe3;
        }
      }
      else {
LAB_002d6fe3:
        pcVar11 = get_room_name(ch->in_room);
      }
      goto LAB_002d71d0;
    case 't':
      uVar15 = (long)time_info.hour % 0xc;
      if ((int)((long)time_info.hour % 0xc) == 0) {
        uVar15 = 0xc;
      }
      pcVar11 = "";
      if (time_info.half != false) {
        pcVar11 = ":30";
      }
      pcVar19 = "am";
      if (0xb < time_info.hour) {
        pcVar19 = "pm";
      }
      sprintf(buf2,"%d%s %s",uVar15 & 0xffffffff,pcVar11,pcVar19);
      goto LAB_002d7290;
    case 'v':
      uVar15 = (ulong)(uint)(int)ch->move;
      break;
    case 'x':
      uVar15 = (ulong)(uint)ch->exp;
      break;
    case 'z':
      bVar7 = is_immortal(ch);
      if ((!bVar7) || (ch->in_room == (ROOM_INDEX_DATA *)0x0)) goto LAB_002d7251;
      pcVar11 = ch->in_room->area->name;
LAB_002d71d0:
      strcpy(buf2,pcVar11);
      goto LAB_002d7290;
    default:
      if (cVar1 == '%') {
        pcVar11 = "%%";
LAB_002d7335:
        sprintf(buf2,pcVar11);
      }
      else {
        if (cVar1 == '1') {
          iVar14 = (int)ch->max_hit;
          if (iVar14 == 0) {
LAB_002d7315:
            pcVar11 = "0%%";
            goto LAB_002d7335;
          }
          iVar9 = ch->hit;
        }
        else {
          if (cVar1 == '2') {
            iVar14 = (int)ch->max_mana;
            if (iVar14 == 0) goto LAB_002d7315;
            sVar2 = ch->mana;
          }
          else {
            if (cVar1 != '3') {
              pcVar19 = " ";
              if (cVar1 == 'C') {
                bVar7 = is_immortal(ch);
                if (!bVar7) goto LAB_002d7251;
                uVar15 = 0;
                ppDVar17 = &descriptor_list;
                while (ppDVar17 = &((DESCRIPTOR_DATA *)ppDVar17)->next->next,
                      (DESCRIPTOR_DATA *)ppDVar17 != (DESCRIPTOR_DATA *)0x0) {
                  if (((DESCRIPTOR_DATA *)ppDVar17)->connected == 0) {
                    bVar7 = can_see(ch,((DESCRIPTOR_DATA *)ppDVar17)->character);
                    uVar15 = (ulong)((int)uVar15 + (uint)bVar7);
                  }
                }
                goto LAB_002d725f;
              }
              goto switchD_002d6daf_caseD_49;
            }
            iVar14 = (int)ch->max_move;
            if (iVar14 == 0) goto LAB_002d7315;
            sVar2 = ch->move;
          }
          iVar9 = (int)sVar2;
        }
        sprintf(buf2,"%d%s",(ulong)(uint)((iVar9 * 100) / iVar14),"%");
      }
      goto LAB_002d7290;
    }
    pcVar11 = "%d";
LAB_002d7289:
    sprintf(buf2,pcVar11,uVar15);
LAB_002d7290:
    pcVar19 = buf2;
switchD_002d6daf_caseD_49:
    for (; cVar1 = *pcVar19, *pcVar10 = cVar1, pcVar11 = pcVar19, cVar1 != '\0';
        pcVar19 = pcVar19 + 1) {
      pcVar10 = pcVar10 + 1;
    }
  } while( true );
}

Assistant:

void bust_a_prompt(CHAR_DATA *ch)
{
	char buf[MAX_STRING_LENGTH];
	char buf2[MAX_STRING_LENGTH], buf3[MSL];
	/*const*/ char *str, *orig;
	const char *i = nullptr;
	char *point;
	char doors[MAX_INPUT_LENGTH];
	EXIT_DATA *pexit;
	int number_people;
	bool found;
	const char *dir_name[] = {"N", "E", "S", "W", "U", "D"};
	int door;
	DESCRIPTOR_DATA *d;
	point = buf;

	if (is_npc(ch)
		|| !str_cmp(ch->prompt, "")
		|| !str_cmp(ch->prompt, "<%hhp %mm %vmv> ")
		|| !str_cmp(ch->prompt, "<%hhp %mm %vmv>"))
	{
		sprintf(buf, "%s<%dhp %dm %dmv>%s ", get_char_color(ch, "prompt"), ch->hit, ch->mana, ch->move, END_COLOR(ch));
		send_to_char(buf, ch);
		return;
	}

	if (IS_SET(ch->comm, COMM_AFK))
		send_to_char("<AFK> ", ch);

	sprintf(buf2, "%s%s%s", get_char_color(ch, "prompt"), ch->prompt, END_COLOR(ch));
	strcpy(&buf3[0], &buf2[0]);
	orig = &buf3[0];
	str = orig;

	while (*str != '\0')
	{
		if (*str != '%')
		{
			*point++ = *str++;
			continue;
		}

		++str;

		switch (*str)
		{
			case 'e':
				found= false;
				doors[0] = '\0';

				for (door = 0; door < 6; door++)
				{
					if ((pexit = ch->in_room->exit[door]) != nullptr
						&& pexit->u1.to_room != nullptr
						&& can_see_room(ch, pexit->u1.to_room)
						&& !IS_SET(pexit->exit_info, EX_NONOBVIOUS)
						&& (!IS_SET(pexit->exit_info, EX_CLOSED) || is_immortal(ch)))
					{
						found = true;
						strcat(doors, dir_name[door]);
					}
				}

				if (!found || (is_affected_by(ch, AFF_BLIND) && !is_immortal(ch)))
					strcat(buf, "none");

				sprintf(buf2, "%s", doors);
				i = buf2;
				break;
			case 'c':
				sprintf(buf2, "%s", "\n\r");
				i = buf2;
				break;
			case 'h':
				if (!IS_SET(ch->comm, COMM_ANSI))
					sprintf(buf2, "%d", ch->hit);
				else
					sprintf(buf2, "%d", ch->hit);

				i = buf2;
				break;
			case 'H':
				sprintf(buf2, "%d", ch->max_hit);
				i = buf2;
				break;
			case 'm':
				sprintf(buf2, "%d", ch->mana);
				i = buf2;
				break;
			case 'M':
				sprintf(buf2, "%d", ch->max_mana);
				i = buf2;
				break;
			case 'L':
				if (ch->wait > 1)
					sprintf(buf2, "+");
				else
					sprintf(buf2, "-");

				i = buf2;
				break;
			case 'v':
				sprintf(buf2, "%d", ch->move);
				i = buf2;
				break;
			case 'V':
				sprintf(buf2, "%d", ch->max_move);
				i = buf2;
				break;
			case '1':
				if (ch->max_hit == 0)
					sprintf(buf2, "0%%");
				else
					sprintf(buf2, "%d%s", (100 * ch->hit) / ch->max_hit, "%");

				i = buf2;
				break;
			case '2':
				if (ch->max_mana == 0)
					sprintf(buf2, "0%%");
				else
					sprintf(buf2, "%d%s", (100 * ch->mana) / ch->max_mana, "%");

				i = buf2;
				break;
			case '3':
				if (ch->max_move == 0)
					sprintf(buf2, "0%%");
				else
					sprintf(buf2, "%d%s", (100 * ch->move) / ch->max_move, "%");

				i = buf2;
				break;
			case 'x':
				sprintf(buf2, "%d", ch->exp);
				i = buf2;
				break;
			case 'X':
				sprintf(buf2, "%d", is_npc(ch) ? 0 : ch->level * exp_per_level(ch) - ch->exp);
				i = buf2;
				break;
			case 'g':
				sprintf(buf2, "%ld", ch->gold);
				i = buf2;
				break;
			case 'a':
				sprintf(buf2, "%s", is_good(ch) ? "good" : is_evil(ch) ? "evil" : "neutral");
				i = buf2;
				break;
			case 'r':
				if (ch->in_room != nullptr)
				{
					sprintf(buf2, "%s",
						((!is_npc(ch) && IS_SET(ch->act, PLR_HOLYLIGHT))
							|| (!is_affected_by(ch, AFF_BLIND) && !room_is_dark(ch->in_room)))
								? get_room_name(ch->in_room)
								: "darkness");
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case 'R':
				if (is_immortal(ch) && ch->in_room != nullptr)
					sprintf(buf2, "%d", ch->in_room->vnum);
				else
					sprintf(buf2, " ");

				i = buf2;
				break;
			case 'z':
				if (is_immortal(ch) && ch->in_room != nullptr)
					sprintf(buf2, "%s", ch->in_room->area->name);
				else
					sprintf(buf2, " ");

				i = buf2;
				break;
			case 'p':
				if (is_immortal(ch) && ch->in_room != nullptr)
				{
					number_people = 0;

					for (d = descriptor_list; d != nullptr; d = d->next)
					{
						if (d->connected == CON_PLAYING
							&& d->character->in_room != nullptr
							&& d->character->in_room->area == ch->in_room->area
							&& !is_immortal(d->character))
						{
							number_people++;
						}
					}

					sprintf(buf2, "%i", number_people);
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case 'P':
				if (is_immortal(ch) && ch->in_room != nullptr)
				{
					number_people = 0;
					for (d = descriptor_list; d != nullptr; d = d->next)
					{
						if (d->connected == CON_PLAYING
							&& d->character->in_room != nullptr
							&& d->character->in_room->area == ch->in_room->area
							&& can_see(ch, d->character))
						{
							number_people++;
						}
					}

					sprintf(buf2, "%i", number_people);
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case 'C':
				if (is_immortal(ch))
				{
					number_people = 0;

					for (d = descriptor_list; d != nullptr; d = d->next)
					{
						if (d->connected == CON_PLAYING && can_see(ch, d->character))
							number_people++;
					}

					sprintf(buf2, "%i", number_people);
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case '%':
				sprintf(buf2, "%%");
				i = buf2;
				break;
			case 'o':
				if (is_editing(ch))
				{
					sprintf(buf2, " (%s - %s)", olc_ed_name(ch), olc_ed_vnum(ch));
					i = buf2;
				}
				break;
			case 't':
				sprintf(buf2, "%d%s %s",
					(time_info.hour % 12 == 0) ? 12 : time_info.hour % 12,
					time_info.half ? ":30" : "",
					(time_info.hour >= 12) ? "pm" : "am");

				i = buf2;
				break;
			case 'q':
				sprintf(buf2, "%d", ch->pcdata->write_next);
				i = buf2;
				break;
			default:
				i = " ";
				break;
		}

		++str;

		while ((*point = *i) != '\0')
		{
			++point, ++i;
		}
	}

	write_to_buffer(ch->desc, buf, point - buf);
	//   free_pstring(orig);
}